

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O2

int32_t __thiscall
icu_63::DateTimePatternGenerator::getTopBitNumber(DateTimePatternGenerator *this,int32_t foundMask)

{
  uint uVar1;
  int iVar2;
  
  if (foundMask != 0) {
    uVar1 = 0;
    for (; foundMask != 0; foundMask = foundMask >> 1) {
      uVar1 = uVar1 + 1;
    }
    iVar2 = 0xf;
    if (uVar1 < 0x11) {
      iVar2 = uVar1 - 1;
    }
    return iVar2;
  }
  return 0;
}

Assistant:

int32_t
DateTimePatternGenerator::getTopBitNumber(int32_t foundMask) const {
    if ( foundMask==0 ) {
        return 0;
    }
    int32_t i=0;
    while (foundMask!=0) {
        foundMask >>=1;
        ++i;
    }
    if (i-1 >UDATPG_ZONE_FIELD) {
        return UDATPG_ZONE_FIELD;
    }
    else
        return i-1;
}